

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_plastic.hpp
# Opt level: O0

Color __thiscall
RoughPlasticBSDF::sample_f
          (RoughPlasticBSDF *this,vec3f *wo,vec3f *wi,HitInfo *hit,bool *isDirac,Sampler *sampler)

{
  uint uVar1;
  long in_RCX;
  vec3f *in_RDX;
  vec3f *in_RSI;
  vec3f *in_RDI;
  float px;
  float fVar2;
  float pz;
  undefined8 uVar5;
  float fVar6;
  Color CVar3;
  vec3f vVar4;
  RoughPlasticBSDF *unaff_retaddr;
  Sampler *in_stack_00000020;
  Color val;
  Type allowed;
  bool through;
  Color f0;
  float pdf;
  vec3f woL;
  vec3f wiL;
  vec3f N2;
  vec3f N1;
  vec3f *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  BSDF *in_stack_fffffffffffffe80;
  vec3f local_15c;
  uint local_150;
  undefined1 local_149;
  vec3f local_148;
  vec3f local_138;
  undefined8 local_128;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  vec3f *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  vec3f local_b0 [5];
  vec3f local_70;
  vec3f local_64;
  vec3f local_58;
  vec3f local_4c [2];
  long local_30;
  vec3f *wi_00;
  vec3f *in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_30 = in_RCX;
  wi_00 = in_RDI;
  vec3f::vec3f(local_4c);
  vec3f::vec3f(&local_58);
  BSDF::getLocalBasis((vec3f *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      in_stack_fffffffffffffee8,
                      (vec3f *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  vec3f::vec3f(&local_64);
  px = dot(in_RSI,local_4c);
  fVar2 = dot(in_RSI,&local_58);
  pz = dot(in_RSI,(vec3f *)(local_30 + 0x10));
  vec3f::vec3f(&local_70,px,fVar2,pz);
  BSDF::albedo(in_stack_fffffffffffffe80,
               (vec2f *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  CVar3 = sample_f(unaff_retaddr,
                   (Color *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   in_stack_fffffffffffffff0,wi_00,&in_RSI->x,(bool *)in_RDX,in_stack_00000020);
  local_b0[0].z = CVar3.z;
  local_b0[0]._0_8_ = CVar3._0_8_;
  ::operator*(fVar2,in_stack_fffffffffffffe40);
  ::operator*(fVar2,in_stack_fffffffffffffe40);
  ::operator+(in_RDI,(vec3f *)CONCAT44(px,fVar2));
  vVar4 = ::operator*(fVar2,in_stack_fffffffffffffe40);
  local_138._0_8_ = vVar4._0_8_;
  local_128._0_4_ = local_138.x;
  local_128._4_4_ = local_138.y;
  local_138 = vVar4;
  vVar4 = ::operator+(in_RDI,(vec3f *)CONCAT44(px,fVar2));
  local_148._0_8_ = vVar4._0_8_;
  local_148.z = vVar4.z;
  in_RDX->x = local_148.x;
  in_RDX->y = local_148.y;
  in_RDX->z = local_148.z;
  local_148 = vVar4;
  fVar2 = dot(in_RSI,(vec3f *)(local_30 + 0x1c));
  uVar1 = (uint)(0.0 < fVar2);
  fVar2 = dot(in_RDX,(vec3f *)(local_30 + 0x1c));
  local_149 = uVar1 != 0.0 < fVar2;
  local_150 = 2;
  if ((bool)local_149) {
    local_150 = 4;
  }
  if ((local_150 & 2) == 0) {
    vec3f::vec3f(&local_15c,0.0);
  }
  else {
    local_15c.x = local_b0[0].x;
    local_15c.y = local_b0[0].y;
    local_15c.z = local_b0[0].z;
  }
  vVar4 = operator/(in_RDI,px);
  CVar3.x = vVar4.x;
  uVar5._4_4_ = vVar4.y;
  register0x00001240 = vVar4.z;
  return CVar3;
}

Assistant:

Color sample_f(const vec3f& wo, vec3f& wi, const HitInfo& hit, bool& isDirac, Sampler& sampler) const
	{
		// generate sample
		vec3f N1,N2;
		getLocalBasis(hit.Ns, N1, N2);
		vec3f wiL, woL = vec3f(dot(wo,N1), dot(wo,N2), dot(wo,hit.Ns));
		float pdf;
		Color f0 = sample_f(albedo(hit.uv), woL, wiL, pdf, isDirac, sampler);
		wi = wiL.x * N1 + wiL.y * N2 + wiL.z * hit.Ns;
		// recalculate to make sure
		// Ng is used to determine whether BRDF or BTDF is used
		bool through = (dot(wo, hit.Ng)>0) ^ (dot(wi, hit.Ng)>0);
		BxDF::Type allowed = through? BxDF::TRANSMIT : BxDF::REFLECT;
		Color val = (BxDF::REFLECT & allowed)? f0: 0;
		return val / pdf;
	}